

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

Function * __thiscall
wasm::EquivalentClass::replaceWithThunk
          (EquivalentClass *this,Builder *builder,Function *target,Function *shared,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *extraArgs,bool isReturn)

{
  string_view target_00;
  uint index;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Type *pTVar4;
  reference __x;
  Type type;
  Call *pCVar5;
  Call *ret;
  Expression **value;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range1;
  LocalGet *local_78;
  uint local_70;
  Index i;
  Type local_60;
  Type targetParams;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  bool isReturn_local;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *extraArgs_local;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params_local;
  Function *shared_local;
  Function *target_local;
  Builder *builder_local;
  EquivalentClass *this_local;
  
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&targetParams);
  local_60 = Function::getParams(target);
  local_70 = 0;
  while( true ) {
    uVar2 = (ulong)local_70;
    sVar3 = wasm::Type::size(&local_60);
    index = local_70;
    if (sVar3 <= uVar2) break;
    pTVar4 = wasm::Type::operator[](&local_60,(ulong)local_70);
    local_78 = Builder::makeLocalGet(builder,index,(Type)pTVar4->id);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&targetParams,
               (value_type *)&local_78);
    local_70 = local_70 + 1;
  }
  __end1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(extraArgs);
  value = (Expression **)
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(extraArgs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                *)&value);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ::operator*(&__end1);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&targetParams,__x)
    ;
    __gnu_cxx::
    __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&__end1);
  }
  target_00 = (shared->super_Importable).super_Named.name.super_IString.str;
  type = Function::getResults(target);
  pCVar5 = Builder::makeCall(builder,(Name)target_00,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &targetParams,type,isReturn);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::clear(&target->vars);
  target->body = (Expression *)pCVar5;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&targetParams);
  return target;
}

Assistant:

Function*
EquivalentClass::replaceWithThunk(Builder& builder,
                                  Function* target,
                                  Function* shared,
                                  const std::vector<ParamInfo>& params,
                                  const std::vector<Expression*>& extraArgs,
                                  bool isReturn) {
  std::vector<Expression*> callOperands;
  Type targetParams = target->getParams();
  for (Index i = 0; i < targetParams.size(); i++) {
    callOperands.push_back(builder.makeLocalGet(i, targetParams[i]));
  }

  for (const auto& value : extraArgs) {
    callOperands.push_back(value);
  }

  auto ret = builder.makeCall(
    shared->name, callOperands, target->getResults(), isReturn);
  target->vars.clear();
  target->body = ret;
  return target;
}